

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcGraft.c
# Opt level: O0

Wlc_Ntk_t * Wlc_NtkGraftMulti(Wlc_Ntk_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Wlc_Ntk_t *pWVar2;
  int iVar3;
  int iVar4;
  Vec_Wrd_t *pVVar5;
  Wlc_Obj_t *pWVar6;
  bool bVar7;
  int t_1;
  Vec_Int_t *t;
  Vec_Mem_t *vTtMem;
  Gia_Man_t *pGia;
  Vec_Int_t *vObjsRHS;
  Vec_Int_t *vObjsLHS;
  Gia_Obj_t *pObj;
  Wlc_Obj_t *pWlcObj;
  Wlc_Ntk_t *pNew;
  word *pInfoObj;
  int local_28;
  int nMultiRHS;
  int nMultiLHS;
  int i;
  int nWords;
  int fVerbose_local;
  Wlc_Ntk_t *p_local;
  
  nMultiLHS = 4;
  pWlcObj = (Wlc_Obj_t *)0x0;
  i = fVerbose;
  _nWords = p;
  vObjsRHS = Wlc_NtkCollectObjs(p,0,&local_28);
  pGia = (Gia_Man_t *)Wlc_NtkCollectObjs(_nWords,1,(int *)((long)&pInfoObj + 4));
  vTtMem = (Vec_Mem_t *)Wlc_NtkBitBlast(_nWords,(Wlc_BstPar_t *)0x0);
  t = (Vec_Int_t *)Vec_MemAlloc(nMultiLHS,10);
  Vec_MemHashAlloc((Vec_Mem_t *)t,10000);
  iVar3 = local_28;
  pVVar1 = vObjsRHS;
  if ((local_28 == 0) && (pInfoObj._4_4_ == 0)) {
    printf("No multipliers are present.\n");
    p_local = (Wlc_Ntk_t *)0x0;
  }
  else if ((local_28 < 1) || (pInfoObj._4_4_ < 1)) {
    if (0 < pInfoObj._4_4_) {
      vObjsRHS = (Vec_Int_t *)pGia;
      pGia = (Gia_Man_t *)pVVar1;
      local_28 = pInfoObj._4_4_;
      pInfoObj._4_4_ = iVar3;
    }
    if (local_28 < 1) {
      __assert_fail("nMultiLHS > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                    ,0xeb,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
    }
    if (pInfoObj._4_4_ != 0) {
      __assert_fail("nMultiRHS == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                    ,0xec,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
    }
    Vec_WrdFreeP((Vec_Wrd_t **)(vTtMem + 0x11));
    iVar3 = Gia_ManObjNum((Gia_Man_t *)vTtMem);
    pVVar5 = Vec_WrdStart(iVar3 * nMultiLHS);
    *(Vec_Wrd_t **)(vTtMem + 0x11) = pVVar5;
    *(int *)&vTtMem[0x10].vTable = nMultiLHS;
    Gia_ManRandomW(1);
    nMultiRHS = 1;
    while( true ) {
      bVar7 = false;
      if (nMultiRHS < *(int *)&vTtMem->ppPages) {
        vObjsLHS = (Vec_Int_t *)Gia_ManObj((Gia_Man_t *)vTtMem,nMultiRHS);
        bVar7 = vObjsLHS != (Vec_Int_t *)0x0;
      }
      if (!bVar7) break;
      iVar3 = Gia_ObjIsAnd((Gia_Obj_t *)vObjsLHS);
      if (iVar3 == 0) {
        iVar3 = Gia_ObjIsCo((Gia_Obj_t *)vObjsLHS);
        if (iVar3 == 0) {
          iVar3 = Gia_ObjIsCi((Gia_Obj_t *)vObjsLHS);
          if (iVar3 == 0) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/wlc/wlcGraft.c"
                          ,0xfc,"Wlc_Ntk_t *Wlc_NtkGraftMulti(Wlc_Ntk_t *, int)");
          }
          Wlc_ObjSimPi((Gia_Man_t *)vTtMem,nMultiRHS);
        }
        else {
          Wlc_ObjSimCo((Gia_Man_t *)vTtMem,nMultiRHS);
        }
      }
      else {
        Wlc_ObjSimAnd((Gia_Man_t *)vTtMem,nMultiRHS);
      }
      nMultiRHS = nMultiRHS + 1;
    }
    pNew = (Wlc_Ntk_t *)Wlc_ObjSim((Gia_Man_t *)vTtMem,0);
    Vec_MemHashInsert((Vec_Mem_t *)t,(word *)pNew);
    for (nMultiRHS = 0; iVar3 = nMultiRHS, iVar4 = Vec_IntSize(vObjsRHS), pWVar2 = _nWords,
        iVar3 < iVar4; nMultiRHS = nMultiRHS + 1) {
      iVar3 = Vec_IntEntry(vObjsRHS,nMultiRHS);
      pObj = (Gia_Obj_t *)Wlc_NtkObj(pWVar2,iVar3);
      iVar3 = Wlc_ObjType((Wlc_Obj_t *)pObj);
      pWVar2 = _nWords;
      if (iVar3 == 0x2d) {
        pWVar6 = Wlc_ObjFanin0(_nWords,(Wlc_Obj_t *)pObj);
        Wlc_NtkSaveOneNode(pWVar2,pWVar6,(Gia_Man_t *)vTtMem,(Vec_Mem_t *)t);
        pWVar2 = _nWords;
        pWVar6 = Wlc_ObjFanin1(_nWords,(Wlc_Obj_t *)pObj);
        Wlc_NtkSaveOneNode(pWVar2,pWVar6,(Gia_Man_t *)vTtMem,(Vec_Mem_t *)t);
        Wlc_NtkSaveOneNode(_nWords,(Wlc_Obj_t *)pObj,(Gia_Man_t *)vTtMem,(Vec_Mem_t *)t);
      }
    }
    for (nMultiRHS = 0; iVar3 = nMultiRHS, iVar4 = Vec_IntSize((Vec_Int_t *)pGia), pWVar2 = _nWords,
        iVar3 < iVar4; nMultiRHS = nMultiRHS + 1) {
      iVar3 = Vec_IntEntry((Vec_Int_t *)pGia,nMultiRHS);
      pObj = (Gia_Obj_t *)Wlc_NtkObj(pWVar2,iVar3);
      Wlc_NtkFindOneNode(_nWords,(Wlc_Obj_t *)pObj,(Gia_Man_t *)vTtMem,(Vec_Mem_t *)t);
    }
    Vec_MemHashFree((Vec_Mem_t *)t);
    Vec_MemFreeP((Vec_Mem_t **)&t);
    Vec_WrdFreeP((Vec_Wrd_t **)(vTtMem + 0x11));
    *(undefined4 *)&vTtMem[0x10].vTable = 0;
    Vec_IntFree(vObjsRHS);
    Vec_IntFree((Vec_Int_t *)pGia);
    Gia_ManStop((Gia_Man_t *)vTtMem);
    p_local = (Wlc_Ntk_t *)pWlcObj;
  }
  else {
    printf("Multipliers are present in both sides of the miter.\n");
    p_local = (Wlc_Ntk_t *)0x0;
  }
  return p_local;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkGraftMulti( Wlc_Ntk_t * p, int fVerbose )
{
    int nWords = 4;
    int i, nMultiLHS, nMultiRHS;
    word * pInfoObj;
    Wlc_Ntk_t * pNew = NULL;
    Wlc_Obj_t * pWlcObj;
    Gia_Obj_t * pObj;
    Vec_Int_t * vObjsLHS = Wlc_NtkCollectObjs( p, 0, &nMultiLHS );
    Vec_Int_t * vObjsRHS = Wlc_NtkCollectObjs( p, 1, &nMultiRHS );
    Gia_Man_t * pGia = Wlc_NtkBitBlast( p, NULL ); //, -1, 0, 0, 0, 0, 1, 0, 0 ); // <= no cleanup
    Vec_Mem_t * vTtMem = Vec_MemAlloc( nWords, 10 );
    Vec_MemHashAlloc( vTtMem, 10000 );

    // check if there are multipliers
    if ( nMultiLHS == 0 && nMultiRHS == 0 )
    {
        printf( "No multipliers are present.\n" );
        return NULL;
    }
    // compare multipliers
    if ( nMultiLHS > 0 && nMultiRHS > 0 )
    {
        printf( "Multipliers are present in both sides of the miter.\n" );
        return NULL;
    }
    // swap if wrong side
    if ( nMultiRHS > 0 )
    {
        ABC_SWAP( Vec_Int_t *, vObjsLHS, vObjsRHS );
        ABC_SWAP( int, nMultiLHS, nMultiRHS );
    }
    assert( nMultiLHS > 0 );
    assert( nMultiRHS == 0 );

    // allocate simulation info for one timeframe
    Vec_WrdFreeP( &pGia->vSims );
    pGia->vSims = Vec_WrdStart( Gia_ManObjNum(pGia) * nWords );
    pGia->nSimWords = nWords;
    // perform simulation
    Gia_ManRandomW( 1 );
    Gia_ManForEachObj1( pGia, pObj, i )
    {
        if ( Gia_ObjIsAnd(pObj) )
            Wlc_ObjSimAnd( pGia, i );
        else if ( Gia_ObjIsCo(pObj) )
            Wlc_ObjSimCo( pGia, i );
        else if ( Gia_ObjIsCi(pObj) )
            Wlc_ObjSimPi( pGia, i );
        else assert( 0 );
    }

    // hash constant 0
    pInfoObj = Wlc_ObjSim( pGia, 0 );
    Vec_MemHashInsert( vTtMem, pInfoObj );

    // hash sim info on the multiplier boundary
    Wlc_NtkForEachObjVec( vObjsLHS, p, pWlcObj, i )
        if ( Wlc_ObjType(pWlcObj) == WLC_OBJ_ARI_MULTI )
        {
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin0(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, Wlc_ObjFanin1(p, pWlcObj), pGia, vTtMem );
            Wlc_NtkSaveOneNode( p, pWlcObj, pGia, vTtMem );
        }

    // check if there are similar signals in LHS
    Wlc_NtkForEachObjVec( vObjsRHS, p, pWlcObj, i )
        Wlc_NtkFindOneNode( p, pWlcObj, pGia, vTtMem );

    // perform grafting


    Vec_MemHashFree( vTtMem );
    Vec_MemFreeP( &vTtMem );

    // cleanup
    Vec_WrdFreeP( &pGia->vSims );
    pGia->nSimWords = 0;

    Vec_IntFree( vObjsLHS );
    Vec_IntFree( vObjsRHS );
    Gia_ManStop( pGia );
    return pNew;
}